

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O0

void mdrop_obj(monst *mon,obj *obj,boolean verbosely)

{
  boolean bVar1;
  int x;
  int y;
  char *pcVar2;
  char *pcVar3;
  int omy;
  int omx;
  boolean verbosely_local;
  obj *obj_local;
  monst *mon_local;
  
  x = (int)mon->mx;
  y = (int)mon->my;
  if (obj->owornmask != 0) {
    if (mon->mhp < 1) {
      if ((((mon->mtame != '\0') && ((obj->owornmask & 0x100000U) != 0)) &&
          ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0)) &&
         (bVar1 = costly_spot(mon->mx,mon->my), bVar1 != '\0')) {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
      }
    }
    else {
      mon->misc_worn_check = (obj->owornmask ^ 0xffffffffU) & mon->misc_worn_check;
      update_mon_intrinsics(level,mon,obj,'\0','\x01');
      if ((obj->owornmask & 0x100U) != 0) {
        setmnotwielded(mon,obj);
      }
    }
    obj->owornmask = 0;
  }
  if ((verbosely != '\0') && ((viz_array[y][x] & 2U) != 0)) {
    pcVar2 = Monnam(mon);
    pcVar3 = distant_name(obj,doname);
    pline("%s drops %s.",pcVar2,pcVar3);
  }
  bVar1 = flooreffects(obj,x,y,"fall");
  if (bVar1 == '\0') {
    place_object(obj,level,x,y);
    stackobj(obj);
  }
  return;
}

Assistant:

static void mdrop_obj(struct monst *mon, struct obj *obj, boolean verbosely)
{
    int omx = mon->mx, omy = mon->my;

    if (obj->owornmask) {
	/* perform worn item handling if the monster is still alive */
	if (mon->mhp > 0) {
	    mon->misc_worn_check &= ~obj->owornmask;
	    update_mon_intrinsics(level, mon, obj, FALSE, TRUE);
	 /* obj_no_longer_held(obj); -- done by place_object */
	    if (obj->owornmask & W_WEP) setmnotwielded(mon, obj);
	/* don't charge for an owned saddle on dead steed */
	} else if (mon->mtame && (obj->owornmask & W_SADDLE) && 
		!obj->unpaid && costly_spot(omx, omy)) {
	    obj->no_charge = 1;
	}
	obj->owornmask = 0L;
    }
    if (verbosely && cansee(omx, omy))
	pline("%s drops %s.", Monnam(mon), distant_name(obj, doname));
    if (!flooreffects(obj, omx, omy, "fall")) {
	place_object(obj, level, omx, omy);
	stackobj(obj);
    }
}